

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O3

bool __thiscall cmSetPropertyCommand::HandleTarget(cmSetPropertyCommand *this,cmTarget *target)

{
  string *prop;
  char *value;
  
  if (this->Remove == false) {
    value = (this->PropertyValue)._M_dataplus._M_p;
  }
  else {
    value = (char *)0x0;
  }
  prop = &this->PropertyName;
  if (this->AppendMode == true) {
    cmTarget::AppendProperty(target,prop,value,this->AppendAsString);
  }
  else {
    cmTarget::SetProperty(target,prop,value);
  }
  cmTarget::CheckProperty(target,prop,(this->super_cmCommand).Makefile);
  return true;
}

Assistant:

bool cmSetPropertyCommand::HandleTarget(cmTarget* target)
{
  // Set or append the property.
  std::string const& name = this->PropertyName;
  const char* value = this->PropertyValue.c_str();
  if (this->Remove) {
    value = nullptr;
  }
  if (this->AppendMode) {
    target->AppendProperty(name, value, this->AppendAsString);
  } else {
    target->SetProperty(name, value);
  }

  // Check the resulting value.
  target->CheckProperty(name, this->Makefile);

  return true;
}